

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_args.c
# Opt level: O2

REF_STATUS ref_args_char(REF_INT n,char **args,char *long_target,char *short_target,char **value)

{
  REF_STATUS RVar1;
  REF_INT pos;
  
  *value = (char *)0x0;
  RVar1 = ref_args_find(n,args,long_target,&pos);
  if (RVar1 == 0) {
    if (n + -1 <= pos) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_args.c",0x39,
             "ref_args_char","missing value");
      short_target = long_target;
      goto LAB_0010e954;
    }
  }
  else {
    RVar1 = ref_args_find(n,args,short_target,&pos);
    if (RVar1 != 0) {
      return 5;
    }
    if (n + -1 <= pos) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_args.c",0x3f,
             "ref_args_char","missing value");
LAB_0010e954:
      printf("for option %s",short_target);
      return 1;
    }
  }
  *value = args[(long)pos + 1];
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_args_char(REF_INT n, char **args,
                                 const char *long_target,
                                 const char *short_target, char **value) {
  REF_INT pos;
  *value = NULL;
  if (REF_SUCCESS == ref_args_find(n, args, long_target, &pos)) {
    RAB(pos < n - 1, "missing value",
        { printf("for option %s", long_target); });
    *value = args[pos + 1];
    return REF_SUCCESS;
  }
  if (REF_SUCCESS == ref_args_find(n, args, short_target, &pos)) {
    RAB(pos < n - 1, "missing value",
        { printf("for option %s", short_target); });
    *value = args[pos + 1];
    return REF_SUCCESS;
  }
  return REF_NOT_FOUND;
}